

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int arith(lua_State *L,int op,char *mtname)

{
  int iVar1;
  char *mtname_local;
  int op_local;
  lua_State *L_local;
  
  iVar1 = tonum(L,1);
  if ((iVar1 != 0) && (iVar1 = tonum(L,2), iVar1 != 0)) {
    lua_arith(L,op);
    return 1;
  }
  trymt(L,mtname);
  return 1;
}

Assistant:

static int arith (lua_State *L, int op, const char *mtname) {
  if (tonum(L, 1) && tonum(L, 2))
    lua_arith(L, op);  /* result will be on the top */
  else
    trymt(L, mtname);
  return 1;
}